

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_thread.c
# Opt level: O0

void end(AVxWorker *worker)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    change_state(worker,(AVxWorkerStatus)((ulong)in_RDI >> 0x20));
    pthread_join(*(pthread_t *)(*in_RDI + 0x58),(void **)0x0);
    pthread_mutex_destroy((pthread_mutex_t *)*in_RDI);
    pthread_cond_destroy((pthread_cond_t *)(*in_RDI + 0x28));
    aom_free(worker);
    *in_RDI = 0;
  }
  return;
}

Assistant:

static void end(AVxWorker *const worker) {
#if CONFIG_MULTITHREAD
  if (worker->impl_ != NULL) {
    change_state(worker, AVX_WORKER_STATUS_NOT_OK);
    pthread_join(worker->impl_->thread_, NULL);
    pthread_mutex_destroy(&worker->impl_->mutex_);
    pthread_cond_destroy(&worker->impl_->condition_);
    aom_free(worker->impl_);
    worker->impl_ = NULL;
  }
#else
  worker->status_ = AVX_WORKER_STATUS_NOT_OK;
  assert(worker->impl_ == NULL);
#endif
  assert(worker->status_ == AVX_WORKER_STATUS_NOT_OK);
}